

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall kj::Own<kj::HttpClient>::dispose(Own<kj::HttpClient> *this)

{
  HttpClient *object;
  HttpClient *ptrCopy;
  Own<kj::HttpClient> *this_local;
  
  object = this->ptr;
  if (object != (HttpClient *)0x0) {
    this->ptr = (HttpClient *)0x0;
    Disposer::dispose<kj::HttpClient>(this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }